

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.c
# Opt level: O0

int X509_cmp_timeframe(X509_VERIFY_PARAM *vpm,ASN1_TIME *start,ASN1_TIME *end)

{
  int iVar1;
  ASN1_TIME *in_RDX;
  ASN1_TIME *in_RSI;
  X509_VERIFY_PARAM *in_RDI;
  unsigned_long flags;
  time_t *time;
  time_t ref_time;
  ulong local_40;
  time_t *local_30;
  time_t local_28;
  ASN1_TIME *local_20;
  ASN1_TIME *local_18;
  X509_VERIFY_PARAM *local_10;
  int local_4;
  
  local_30 = (time_t *)0x0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_RDI == (X509_VERIFY_PARAM *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = X509_VERIFY_PARAM_get_flags((X509_VERIFY_PARAM *)in_RDI);
  }
  if ((local_40 & 2) == 0) {
    if ((local_40 & 0x200000) != 0) {
      return 0;
    }
  }
  else {
    local_28 = X509_VERIFY_PARAM_get_time(local_10);
    local_30 = &local_28;
  }
  if ((local_20 == (ASN1_TIME *)0x0) || (iVar1 = X509_cmp_time(local_20,local_30), -1 < iVar1)) {
    if ((local_18 == (ASN1_TIME *)0x0) || (iVar1 = X509_cmp_time(local_18,local_30), iVar1 < 1)) {
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int X509_cmp_timeframe(const X509_VERIFY_PARAM *vpm,
                       const ASN1_TIME *start, const ASN1_TIME *end)
{
    time_t ref_time;
    time_t *time = NULL;
    unsigned long flags = vpm == NULL ? 0 : X509_VERIFY_PARAM_get_flags(vpm);

    if ((flags & X509_V_FLAG_USE_CHECK_TIME) != 0) {
        ref_time = X509_VERIFY_PARAM_get_time(vpm);
        time = &ref_time;
    } else if ((flags & X509_V_FLAG_NO_CHECK_TIME) != 0) {
        return 0; /* this means ok */
    } /* else reference time is the current time */

    if (end != NULL && X509_cmp_time(end, time) < 0)
        return 1;
    if (start != NULL && X509_cmp_time(start, time) > 0)
        return -1;
    return 0;
}